

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

bool icu_63::number::impl::GeneratorHelpers::perUnit
               (MacroProps *macros,UnicodeString *sb,UErrorCode *status)

{
  int iVar1;
  char *pcVar2;
  UErrorCode *extraout_RDX;
  MeasureUnit *this;
  
  this = &macros->perUnit;
  pcVar2 = MeasureUnit::getType(this);
  iVar1 = strcmp("none",pcVar2);
  if (iVar1 == 0) {
    pcVar2 = MeasureUnit::getSubtype(this);
    iVar1 = strcmp("percent",pcVar2);
    if (iVar1 != 0) {
      pcVar2 = MeasureUnit::getSubtype(this);
      iVar1 = strcmp("permille",pcVar2);
      if (iVar1 != 0) {
        return false;
      }
    }
  }
  else {
    pcVar2 = MeasureUnit::getType(this);
    iVar1 = strcmp("currency",pcVar2);
    if (iVar1 != 0) {
      UnicodeString::doAppend(sb,L"per-measure-unit/",0,-1);
      blueprint_helpers::generateMeasureUnitOption(this,sb,extraout_RDX);
      return true;
    }
  }
  *status = U_UNSUPPORTED_ERROR;
  return false;
}

Assistant:

bool GeneratorHelpers::perUnit(const MacroProps& macros, UnicodeString& sb, UErrorCode& status) {
    // Per-units are currently expected to be only MeasureUnits.
    if (utils::unitIsNoUnit(macros.perUnit)) {
        if (utils::unitIsPercent(macros.perUnit) || utils::unitIsPermille(macros.perUnit)) {
            status = U_UNSUPPORTED_ERROR;
            return false;
        } else {
            // Default value: ok to ignore
            return false;
        }
    } else if (utils::unitIsCurrency(macros.perUnit)) {
        status = U_UNSUPPORTED_ERROR;
        return false;
    } else {
        sb.append(u"per-measure-unit/", -1);
        blueprint_helpers::generateMeasureUnitOption(macros.perUnit, sb, status);
        return true;
    }
}